

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
CanStorePropertyValueDirectly
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,bool allowLetConst)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSStack_20;
  int i;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  
  if (propertyId == -1) {
    bVar2 = true;
  }
  else {
    local_30 = ScriptContext::GetPropertyName
                         ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                          ->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
    bVar2 = JsUtil::
            BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
            ::TryGetReference<Js::PropertyRecord_const*>
                      ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                        *)(this->propertyMap).ptr,&local_30,&stack0xffffffffffffffe0,
                       (int *)((long)&propertyRecord + 4));
    if (bVar2) {
      if ((!allowLetConst) || (bVar2 = true, (pSStack_20->Attributes & 0x10) == 0)) {
        if ((pSStack_20->Attributes & 0x10) != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0xbd2,"(!(descriptor->Attributes & 0x10))",
                                      "Asking about a global property this type handler doesn\'t have?"
                                     );
          if (!bVar2) goto LAB_00de614d;
          *puVar3 = 0;
        }
        bVar2 = ((uint)*pSStack_20 & 6) == 2;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0xbd8,"(false)",
                                  "Asking about a property this type handler doesn\'t know about?");
      if (!bVar2) {
LAB_00de614d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::CanStorePropertyValueDirectly(const DynamicObject* instance, PropertyId propertyId, bool allowLetConst)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;

        // We pass Constants::NoProperty for ActivationObjects for functions with same named formals.
        if (propertyId == Constants::NoProperty)
        {
            return true;
        }

        PropertyRecord const* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if (allowLetConst && (descriptor->Attributes & PropertyLetConstGlobal))
            {
                return true;
            }
            else
            {
                AssertMsg(!(descriptor->Attributes & PropertyLetConstGlobal), "Asking about a global property this type handler doesn't have?");
                return !descriptor->IsOrMayBecomeFixed();
            }
        }
        else
        {
            AssertMsg(false, "Asking about a property this type handler doesn't know about?");
            return false;
        }
    }